

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O3

void __thiscall Assimp::LWO::Face::Face(Face *this,Face *f)

{
  (this->super_aiFace).mNumIndices = 0;
  (this->super_aiFace).mIndices = (uint *)0x0;
  aiFace::operator=(&this->super_aiFace,&f->super_aiFace);
  this->surfaceIndex = f->surfaceIndex;
  this->smoothGroup = f->smoothGroup;
  this->type = f->type;
  return;
}

Assistant:

Face(const Face& f) : aiFace() {
        *this = f;
    }